

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

void __thiscall
cpptrace::stacktrace::print_with_snippets
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  size_type *frame;
  pointer psVar1;
  pointer psVar2;
  uint frame_number_width;
  int *piVar3;
  ostream *poVar4;
  undefined7 in_register_00000011;
  ulong target_line;
  char *pcVar5;
  string *path;
  size_t counter;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000011,color) != 0) {
    if (stream == (ostream *)&std::cout) {
      piVar3 = &stdout_fileno;
    }
    else {
      if (stream != (ostream *)&std::cerr) goto LAB_0012cb50;
      piVar3 = &stderr_fileno;
    }
    detail::isatty(*piVar3);
  }
LAB_0012cb50:
  pcVar5 = "Stack trace (most recent call first):";
  if (header != (char *)0x0) {
    pcVar5 = header;
  }
  poVar4 = std::operator<<(stream,pcVar5);
  std::operator<<(poVar4,'\n');
  psVar1 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 != psVar2) {
    frame_number_width = detail::n_digits((int)(((long)psVar2 - (long)psVar1) / 0x60) - 1);
    psVar1 = (this->frames).
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    counter = 0;
    for (path = &((this->frames).
                  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                  ._M_impl.super__Vector_impl_data._M_start)->filename;
        frame = &path[-1]._M_string_length, (pointer)frame != psVar1; path = path + 3) {
      print_frame(stream,color,frame_number_width,counter,(stacktrace_frame *)frame);
      if ((newline_at_end) ||
         ((pointer)frame !=
          (this->frames).
          super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1)) {
        std::operator<<(stream,'\n');
      }
      target_line = (ulong)*(uint *)((long)&path[-1].field_2 + 8);
      if ((target_line != 0xffffffff) && (path->_M_string_length != 0)) {
        detail::get_snippet(&local_50,path,target_line,2,color);
        std::operator<<(stream,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      counter = counter + 1;
    }
    return;
  }
  poVar4 = std::operator<<(stream,"<empty trace>");
  std::operator<<(poVar4,'\n');
  return;
}

Assistant:

void stacktrace::print_with_snippets(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>" << '\n';
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            if(frame.line.has_value() && !frame.filename.empty()) {
                stream << detail::get_snippet(frame.filename, frame.line.value(), 2, color);
            }
            counter++;
        }
    }